

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

uint __thiscall Kernel::Clause::maxVar(Clause *this)

{
  long *plVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  VirtualIterator<unsigned_int> it;
  long *local_20;
  
  getVariableIterator((Clause *)&local_20);
  uVar4 = 0;
  while( true ) {
    cVar2 = (**(code **)(*local_20 + 0x10))(local_20);
    if (cVar2 == '\0') break;
    uVar3 = (**(code **)(*local_20 + 0x18))(local_20);
    if (uVar4 < uVar3) {
      uVar4 = uVar3;
    }
  }
  plVar1 = local_20 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  if ((int)*plVar1 == 0) {
    (**(code **)(*local_20 + 8))(local_20);
  }
  return uVar4;
}

Assistant:

unsigned Clause::maxVar()
{
  unsigned max = 0;
  VirtualIterator<unsigned> it = getVariableIterator();

  while (it.hasNext()) {
    unsigned n = it.next();
    max = n > max ? n : max;
  }
  return max;
}